

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O0

void __thiscall cppcms::plugin::signature_error::~signature_error(signature_error *this)

{
  bad_cast *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__signature_error_0052ffc8;
  (in_RDI->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__signature_error_0052fff0;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  booster::bad_cast::~bad_cast(in_RDI);
  return;
}

Assistant:

signature_error::~signature_error() throw() {}